

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined1 (*pauVar13) [32];
  int iVar14;
  float *pfVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  
  uVar2 = b->c;
  iVar11 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar14 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar16 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar16 = 0;
    }
    for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
      fVar1 = *a->data;
      auVar17._4_4_ = fVar1;
      auVar17._0_4_ = fVar1;
      auVar17._8_4_ = fVar1;
      auVar17._12_4_ = fVar1;
      pvVar3 = b->data;
      sVar4 = b->elemsize;
      sVar5 = b->cstep;
      pfVar15 = (float *)(sVar5 * uVar10 * sVar4 + (long)pvVar3);
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pauVar13 = (undefined1 (*) [32])(sVar8 * uVar10 * sVar7 + (long)pvVar6);
      lVar12 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar11; iVar14 = iVar14 + 8) {
        auVar18._0_4_ = fVar1 * *pfVar15;
        auVar18._4_4_ = fVar1 * pfVar15[1];
        auVar18._8_4_ = fVar1 * pfVar15[2];
        auVar18._12_4_ = fVar1 * pfVar15[3];
        auVar18._16_4_ = fVar1 * pfVar15[4];
        auVar18._20_4_ = fVar1 * pfVar15[5];
        auVar18._28_36_ = in_ZMM1._28_36_;
        auVar18._24_4_ = fVar1 * pfVar15[6];
        in_ZMM1 = ZEXT3264(auVar18._0_32_);
        *pauVar13 = auVar18._0_32_;
        pfVar15 = pfVar15 + 8;
        pauVar13 = pauVar13 + 1;
        lVar12 = lVar12 + 8;
      }
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      in_ZMM1 = ZEXT1664(auVar17);
      for (; iVar14 + 3 < iVar11; iVar14 = iVar14 + 4) {
        auVar19._0_4_ = auVar17._0_4_ * *pfVar15;
        auVar19._4_4_ = auVar17._4_4_ * pfVar15[1];
        auVar19._8_4_ = auVar17._8_4_ * pfVar15[2];
        auVar19._12_4_ = auVar17._12_4_ * pfVar15[3];
        *(undefined1 (*) [16])*pauVar13 = auVar19;
        pfVar15 = pfVar15 + 4;
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
        lVar12 = lVar12 + 4;
      }
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar9 = fVar1 * *(float *)((long)pvVar3 + lVar12 * 4 + sVar5 * sVar4 * uVar10);
        in_ZMM1 = ZEXT464((uint)fVar9);
        *(float *)((long)pvVar6 + lVar12 * 4 + sVar8 * sVar7 * uVar10) = fVar9;
      }
    }
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}